

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O0

bool __thiscall crnlib::cfile_stream::seek(cfile_stream *this,int64 ofs,bool relative)

{
  bool bVar1;
  int iVar2;
  ulong local_40;
  int64 new_ofs;
  bool relative_local;
  int64 ofs_local;
  cfile_stream *this_local;
  
  if ((((this->super_data_stream).field_0x1a & 1) == 0) ||
     (bVar1 = data_stream::is_seekable(&this->super_data_stream), !bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    local_40 = ofs;
    if (relative) {
      local_40 = this->m_ofs + ofs;
    }
    if ((long)local_40 < 0) {
      this_local._7_1_ = false;
    }
    else if (this->m_size < local_40) {
      this_local._7_1_ = false;
    }
    else {
      if (local_40 != this->m_ofs) {
        iVar2 = fseeko64((FILE *)this->m_pFile,local_40,0);
        if (iVar2 != 0) {
          data_stream::set_error(&this->super_data_stream);
          return false;
        }
        this->m_ofs = local_40;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

virtual bool seek(int64 ofs, bool relative)
        {
            if ((!m_opened) || (!is_seekable()))
            {
                return false;
            }

            int64 new_ofs = relative ? (m_ofs + ofs) : ofs;
            if (new_ofs < 0)
            {
                return false;
            }
            else if (static_cast<uint64>(new_ofs) > m_size)
            {
                return false;
            }

            if (static_cast<uint64>(new_ofs) != m_ofs)
            {
                if (crn_fseek(m_pFile, new_ofs, SEEK_SET) != 0)
                {
                    set_error();
                    return false;
                }

                m_ofs = new_ofs;
            }

            return true;
        }